

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# validation.cpp
# Opt level: O0

ATMPArgs *
anon_unknown.dwarf_2401980::MemPoolAccept::ATMPArgs::SingleAccept
          (CChainParams *chainparams,int64_t accept_time,bool bypass_limits,
          vector<COutPoint,_std::allocator<COutPoint>_> *coins_to_uncache,bool test_accept)

{
  long lVar1;
  optional<CFeeRate> client_maxfeerate;
  _Storage<CFeeRate,_true> in_RSI;
  ATMPArgs *in_RDI;
  long in_FS_OFFSET;
  undefined2 in_stack_ffffffffffffff58;
  undefined1 in_stack_ffffffffffffff5a;
  undefined1 in_stack_ffffffffffffff5b;
  undefined1 in_stack_ffffffffffffff5c;
  undefined1 in_stack_ffffffffffffff5d;
  undefined1 in_stack_ffffffffffffff5e;
  undefined1 in_stack_ffffffffffffff5f;
  undefined4 in_stack_ffffffffffffff64;
  undefined1 in_stack_ffffffffffffff6f;
  uint in_stack_ffffffffffffff74;
  CChainParams *in_stack_ffffffffffffffe8;
  undefined8 uStack_10;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  std::optional<CFeeRate>::optional
            ((optional<CFeeRate> *)
             CONCAT17(in_stack_ffffffffffffff5f,
                      CONCAT16(in_stack_ffffffffffffff5e,
                               CONCAT15(in_stack_ffffffffffffff5d,
                                        CONCAT14(in_stack_ffffffffffffff5c,
                                                 CONCAT13(in_stack_ffffffffffffff5b,
                                                          CONCAT12(in_stack_ffffffffffffff5a,
                                                                   in_stack_ffffffffffffff58)))))));
  client_maxfeerate.super__Optional_base<CFeeRate,_true,_true>._M_payload.
  super__Optional_payload_base<CFeeRate>._8_8_ = in_stack_ffffffffffffffe8;
  client_maxfeerate.super__Optional_base<CFeeRate,_true,_true>._M_payload.
  super__Optional_payload_base<CFeeRate>._M_payload = in_RSI;
  ATMPArgs(uStack_10,in_stack_ffffffffffffffe8,(ulong)in_stack_ffffffffffffff74 << 0x20,
           (bool)in_stack_ffffffffffffff6f,
           (vector<COutPoint,_std::allocator<COutPoint>_> *)CONCAT44(in_stack_ffffffffffffff64,1),
           (bool)in_stack_ffffffffffffff5f,(bool)in_stack_ffffffffffffff5e,
           (bool)in_stack_ffffffffffffff5d,(bool)in_stack_ffffffffffffff5c,false,client_maxfeerate,
           false);
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
    return in_RDI;
  }
  __stack_chk_fail();
}

Assistant:

static ATMPArgs SingleAccept(const CChainParams& chainparams, int64_t accept_time,
                                     bool bypass_limits, std::vector<COutPoint>& coins_to_uncache,
                                     bool test_accept) {
            return ATMPArgs{/* m_chainparams */ chainparams,
                            /* m_accept_time */ accept_time,
                            /* m_bypass_limits */ bypass_limits,
                            /* m_coins_to_uncache */ coins_to_uncache,
                            /* m_test_accept */ test_accept,
                            /* m_allow_replacement */ true,
                            /* m_allow_sibling_eviction */ true,
                            /* m_package_submission */ false,
                            /* m_package_feerates */ false,
                            /* m_client_maxfeerate */ {}, // checked by caller
                            /* m_allow_carveouts */ true,
            };
        }